

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptMemoryDumper.cpp
# Opt level: O3

void __thiscall ScriptMemoryDumper::Init(ScriptMemoryDumper *this)

{
  PropertyId PVar1;
  DynamicObject *pDVar2;
  
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"pageCount",9);
  this->pageCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"objectSize",10);
  this->objectSizeId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"freeObjectCount",0xf);
  this->freeObjectCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked
                    (this->scriptContext,L"activeObjectCount",0x11);
  this->activeObjectCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"totalByteCount",0xe);
  this->totalByteCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"finalizeCount",0xd);
  this->finalizeCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked
                    (this->scriptContext,L"weakReferenceCount",0x12);
  this->weakReferenceCountId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"largeObjects",0xc);
  this->largeObjectsId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked
                    (this->scriptContext,L"activeObjectByteSize",0x14);
  this->activeObjectByteSizeId = PVar1;
  PVar1 = Js::ScriptContext::GetOrAddPropertyIdTracked(this->scriptContext,L"summary",7);
  this->summaryId = PVar1;
  pDVar2 = Js::JavascriptLibrary::CreateObject
                     ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  this->dumpObject = pDVar2;
  return;
}

Assistant:

void ScriptMemoryDumper::Init()
{
    pageCountId = scriptContext->GetOrAddPropertyIdTracked(_u("pageCount"));
    objectSizeId = scriptContext->GetOrAddPropertyIdTracked(_u("objectSize"));
    freeObjectCountId = scriptContext->GetOrAddPropertyIdTracked(_u("freeObjectCount"));
    activeObjectCountId = scriptContext->GetOrAddPropertyIdTracked(_u("activeObjectCount"));
    totalByteCountId = scriptContext->GetOrAddPropertyIdTracked(_u("totalByteCount"));
    finalizeCountId = scriptContext->GetOrAddPropertyIdTracked(_u("finalizeCount"));
    weakReferenceCountId = scriptContext->GetOrAddPropertyIdTracked(_u("weakReferenceCount"));
    largeObjectsId = scriptContext->GetOrAddPropertyIdTracked(_u("largeObjects"));
    activeObjectByteSizeId = scriptContext->GetOrAddPropertyIdTracked(_u("activeObjectByteSize"));
    summaryId = scriptContext->GetOrAddPropertyIdTracked(_u("summary"));
    dumpObject = scriptContext->GetLibrary()->CreateObject();
}